

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O3

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::calc_price
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  long lVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  undefined8 *puVar5;
  long lVar6;
  ostream *poVar7;
  int iVar8;
  size_t __n;
  ulong uVar9;
  pointer pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  int b;
  int a;
  string line;
  string num;
  string line1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v1;
  ifstream file;
  ifstream infile;
  long arr [235] [235];
  int aiStack_6c428 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_6c420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_6c418;
  long lStack_6c410;
  undefined1 *puStack_6c408;
  ulong uStack_6c400;
  undefined1 uStack_6c3f8;
  undefined7 uStack_6c3f7;
  undefined1 *puStack_6c3e8;
  undefined8 uStack_6c3e0;
  undefined1 uStack_6c3d8;
  undefined7 uStack_6c3d7;
  uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *puStack_6c3c8;
  string sStack_6c3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_6c3a0;
  istringstream aiStack_6c388 [120];
  ios_base aiStack_6c310 [264];
  long alStack_6c208 [4];
  byte abStack_6c1e8 [488];
  long alStack_6c000 [65];
  long alStack_6bdf8 [55225];
  
  puStack_6c408 = &uStack_6c3f8;
  uStack_6c400 = 0;
  uStack_6c3f8 = 0;
  puStack_6c3e8 = &uStack_6c3d8;
  uStack_6c3e0 = 0;
  uStack_6c3d8 = 0;
  pbStack_6c420 = des;
  pbStack_6c418 = src;
  puStack_6c3c8 = this;
  std::ifstream::ifstream(alStack_6c000,"fare.csv",_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file",0x13);
  }
  else {
    lStack_6c410 = 0;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(alStack_6c000[0] + -0x18));
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)alStack_6c000,(string *)&puStack_6c408,cVar2);
      lVar1 = lStack_6c410;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      if ((int)uStack_6c400 != 0) {
        uVar12 = (ulong)((int)uStack_6c400 - 1);
        uVar13 = uStack_6c400 & 0xffffffff;
        uVar9 = 0;
        uVar11 = 0;
        iVar8 = 0;
        do {
          if (uVar9 == uVar12 || puStack_6c408[uVar9] == ',') {
            puVar5 = (undefined8 *)
                     std::__cxx11::string::append
                               ((string *)&puStack_6c3e8,(ulong)&puStack_6c408,(long)(int)uVar11);
            dVar14 = atof((char *)*puVar5);
            lVar6 = (long)iVar8;
            iVar8 = iVar8 + 1;
            alStack_6bdf8[lVar1 * 0xeb + lVar6] = (long)dVar14;
            uStack_6c3e0 = 0;
            *puStack_6c3e8 = 0;
            if (uVar9 != uVar12) {
              uVar11 = uVar9 + 1 & 0xffffffff;
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar13);
      }
      lStack_6c410 = lStack_6c410 + 1;
    }
    std::ifstream::close();
  }
  sStack_6c3c0._M_dataplus._M_p = (pointer)&sStack_6c3c0.field_2;
  sStack_6c3c0._M_string_length = 0;
  sStack_6c3c0.field_2._M_local_buf[0] = '\0';
  iVar8 = 0;
  aiStack_6c428[1] = 0;
  aiStack_6c428[0] = 0;
  std::ifstream::ifstream(alStack_6c208,"stations.txt",_S_in);
  do {
    if ((abStack_6c1e8[*(long *)(alStack_6c208[0] + -0x18)] & 2) != 0) break;
    cVar2 = std::ios::widen((char)aiStack_6c428 + (char)*(long *)(alStack_6c208[0] + -0x18) + ' ');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)alStack_6c208,(string *)&sStack_6c3c0,cVar2);
    split(&vStack_6c3a0,puStack_6c3c8,&sStack_6c3c0,'\t');
    pbVar10 = vStack_6c3a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = vStack_6c3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
    if ((__n == pbStack_6c418->_M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp(vStack_6c3a0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                      (pbStack_6c418->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
      std::__cxx11::istringstream::istringstream(aiStack_6c388,(string *)pbVar10,_S_in);
      std::istream::operator>>((istream *)aiStack_6c388,aiStack_6c428 + 1);
      iVar8 = iVar8 + 1;
      std::__cxx11::istringstream::~istringstream(aiStack_6c388);
      std::ios_base::~ios_base(aiStack_6c310);
      __n = vStack_6c3a0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
      pbVar10 = vStack_6c3a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((__n == pbStack_6c420->_M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp(pbVar10[1]._M_dataplus._M_p,(pbStack_6c420->_M_dataplus)._M_p,__n), iVar3 == 0
        )))) {
      std::__cxx11::istringstream::istringstream(aiStack_6c388,(string *)pbVar10,_S_in);
      std::istream::operator>>((istream *)aiStack_6c388,aiStack_6c428);
      iVar8 = iVar8 + 1;
      std::__cxx11::istringstream::~istringstream(aiStack_6c388);
      std::ios_base::~ios_base(aiStack_6c310);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_6c3a0);
  } while (iVar8 != 2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t\t",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_e761,0x10)
  ;
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::ifstream::~ifstream(alStack_6c208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_6c3c0._M_dataplus._M_p != &sStack_6c3c0.field_2) {
    operator_delete(sStack_6c3c0._M_dataplus._M_p,
                    CONCAT71(sStack_6c3c0.field_2._M_allocated_capacity._1_7_,
                             sStack_6c3c0.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(alStack_6c000);
  if (puStack_6c3e8 != &uStack_6c3d8) {
    operator_delete(puStack_6c3e8,CONCAT71(uStack_6c3d7,uStack_6c3d8) + 1);
  }
  if (puStack_6c408 != &uStack_6c3f8) {
    operator_delete(puStack_6c408,CONCAT71(uStack_6c3f7,uStack_6c3f8) + 1);
  }
  return;
}

Assistant:

void calc_price(ver src, ver des) {
      /*fare calculation and prints fare using fare.csv*/
      string line, num;
      int row = 0, col = 0, k = 0, len = 0, last = 0;
      long arr[235][235];
      ifstream infile("fare.csv");//read fare.csv excel database

      if (infile.is_open()) {
        while (getline(infile, line)) {
          // Takes complete row
          // cout << line<< '\n';
          k = 0, last = 0, col = 0;
          len = line.length();
          while (k != len) {
            if (line[k] == ',' || k == len - 1) {
              //for converting string into number
              arr[row][col] = atof(num.append(line, last, k).c_str());
              //Emptying string for getting next data
              num.clear();

              //increasing column number after saving data
              col++;

              if (k != len - 1)
                last = k + 1;
            }
            k++;
          }
          //increase row number for array
          row++;
        }
        //close the file
        infile.close();
      }
      else cerr << "Unable to open file";
      string line1;
      int a = 0, b = 0, f = 0;
      ifstream file("stations.txt");

      while (!file.eof()) {
        getline(file, line1);
        auto v1 = split(line1, '\t');
        if (v1[1] == src) {
          f++;
          std::istringstream(v1[0]) >> a;
        }
        if (v1[1] == des) {
          f++;
          std::istringstream(v1[0]) >> b;
        }
        if (f == 2) //both src and des covered
          break;
      }
      cout << endl << "\t\t\t";
      cout << "--> Fare is: र" << arr[a - 1][b - 1] << endl;
    }